

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O0

char * __thiscall HttpFieldMap::getFieldTypeString(HttpFieldMap *this,FieldType type)

{
  FieldType type_local;
  HttpFieldMap *this_local;
  
  if ((type < 1000) || (0x416 < type)) {
    this_local = (HttpFieldMap *)0x0;
  }
  else {
    this_local = (HttpFieldMap *)gFieldTypeList[type + -1000];
  }
  return (char *)this_local;
}

Assistant:

const char * HttpFieldMap::getFieldTypeString(FieldType type) const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (type >= FieldMap::kHttpFieldMapStart and type < kNumFields)
	{
		type -= FieldMap::kHttpFieldMapStart;
		
		LOG("type %d, name %s",
				   type, gFieldTypeList[type]);
		
		return gFieldTypeList[type];
	}
	return NULL;
}